

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyConvexHullAuxRef::SetupBody
          (ChBodyEasyConvexHullAuxRef *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          double density,bool visualize,bool collide,shared_ptr<chrono::ChMaterialSurface> *material
          )

{
  shared_ptr<chrono::collision::ChCollisionModel> *psVar1;
  long lVar2;
  long lVar3;
  pointer pCVar4;
  element_type *peVar5;
  uint uVar6;
  ulong uVar7;
  Scalar SVar8;
  ChConvexHullLibraryWrapper lh;
  shared_ptr<chrono::ChTriangleMeshShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_reduced;
  ChVector<double> baricenter;
  ChVector<double> v;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_140;
  double mass;
  shared_ptr<chrono::ChVisualShape> local_128;
  __shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ChVectorN<double,_3> principal_I;
  ChMatrix33<double> inertia;
  ChMatrix33<double> principal_inertia_csys;
  
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  collision::bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&lh);
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                *)&v,&((vshape.
                        super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->trimesh).
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  collision::bt_utils::ChConvexHullLibraryWrapper::ComputeHull
            (&lh,points,(ChTriangleMeshConnected *)v.m_data[0]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
  peVar5 = vshape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (visualize) {
    std::__cxx11::to_string
              ((string *)&inertia,
               (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj.m_identifier)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   "chull_mesh_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inertia);
    std::__cxx11::string::_M_assign((string *)&peVar5->name);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&inertia);
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChTriangleMeshShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_128,
               &vshape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
    inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    principal_inertia_csys.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    principal_inertia_csys.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    principal_inertia_csys.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    ChFrame<double>::ChFrame
              ((ChFrame<double> *)&v,(ChVector<double> *)&principal_inertia_csys,
               (ChQuaternion<double> *)&inertia);
    ChVisualModel::AddShape((ChVisualModel *)baricenter.m_data[0],&local_128,(ChFrame<double> *)&v);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_128.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)&baricenter);
    ChPhysicsItem::AddVisualModel
              ((ChPhysicsItem *)this,(shared_ptr<chrono::ChVisualModel> *)&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(baricenter.m_data + 1));
  }
  baricenter.m_data[2] = 0.0;
  baricenter.m_data[0] = 0.0;
  baricenter.m_data[1] = 0.0;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                *)&v,&((vshape.
                        super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->trimesh).
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  geometry::ChTriangleMeshConnected::ComputeMassProperties
            ((ChTriangleMeshConnected *)v.m_data[0],true,&mass,&baricenter,&inertia);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
  ChMatrix33<double>::SelfAdjointEigenSolve(&inertia,&principal_inertia_csys,&principal_I);
  SVar8 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                    (&principal_inertia_csys.super_Matrix<double,_3,_3,_1,_3,_3>);
  if (SVar8 < 0.0) {
    points_reduced.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)&DAT_bff0000000000000;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)&v,
                    &principal_inertia_csys.super_Matrix<double,_3,_3,_1,_3,_3>,0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_> *)&v,
               (Scalar *)&points_reduced);
  }
  (this->super_ChBodyAuxRef).super_ChBody.density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass
            (&(this->super_ChBodyAuxRef).super_ChBody.variables,density * mass);
  v.m_data[0] = density * principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0];
  v.m_data[1] = density * principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1];
  v.m_data[2] = density * principal_I.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[2];
  ChBody::SetInertiaXX((ChBody *)this,&v);
  ChFrame<double>::ChFrame((ChFrame<double> *)&v,&baricenter,&principal_inertia_csys);
  ChBodyAuxRef::SetFrame_COG_to_REF(&this->super_ChBodyAuxRef,(ChFrame<double> *)&v);
  if (collide) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x164,
                    "void chrono::ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    points_reduced.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points_reduced.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    points_reduced.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  *)&v,&((vshape.
                          super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->trimesh).
                        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                );
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&points_reduced,
               (*(long *)((long)v.m_data[0] + 0x10) - *(long *)((long)v.m_data[0] + 8)) / 0x18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    *)&v,&((vshape.
                            super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->trimesh).
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  );
      lVar2 = *(long *)((long)v.m_data[0] + 0x10);
      lVar3 = *(long *)((long)v.m_data[0] + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      if ((ulong)((lVar2 - lVar3) / 0x18) <= uVar7) break;
      std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                    *)&v,&((vshape.
                            super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->trimesh).
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  );
      pCVar4 = *(pointer *)((long)v.m_data[0] + 8);
      if (pCVar4 != points_reduced.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        points_reduced.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[0] = pCVar4[uVar7].m_data[0];
        points_reduced.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[1] = pCVar4[uVar7].m_data[1];
        points_reduced.
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[2] = pCVar4[uVar7].m_data[2];
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      uVar6 = uVar6 + 1;
    }
    psVar1 = &(this->super_ChBodyAuxRef).super_ChBody.collision_model;
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)&v,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*(long *)v.m_data[0] + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_118,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_140,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_e8 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&v,1.0);
    (*(local_118._M_ptr)->_vptr_ChCollisionModel[0xf])
              (local_118._M_ptr,&local_140,&points_reduced,&local_f8,&v);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)&v,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*(long *)v.m_data[0] + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    ChBody::SetCollide((ChBody *)this,true);
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&points_reduced.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
  }
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                *)&v,&((vshape.
                        super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->trimesh).
                      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->m_mesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> *)
             &v);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vshape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>>& points,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    auto vshape = chrono_types::make_shared<ChTriangleMeshShape>();
    collision::bt_utils::ChConvexHullLibraryWrapper lh;
    lh.ComputeHull(points, *vshape->GetMesh());
    if (visualize) {
        vshape->SetName("chull_mesh_" + std::to_string(GetIdentifier()));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }

    double mass;
    ChVector<> baricenter;
    ChMatrix33<> inertia;
    vshape->GetMesh()->ComputeMassProperties(true, mass, baricenter, inertia);

    ChMatrix33<> principal_inertia_csys;
    ChVectorN<double, 3> principal_I;
    inertia.SelfAdjointEigenSolve(principal_inertia_csys, principal_I);
    if (principal_inertia_csys.determinant() < 0)
        principal_inertia_csys.col(0) *= -1;

    SetDensity((float)density);
    SetMass(mass * density);
    // this->SetInertia(inertia * density);
    SetInertiaXX(ChVector<>(principal_I) * density);

    // Set the COG coordinates to barycenter, without displacing the REF reference
    SetFrame_COG_to_REF(ChFrame<>(baricenter, principal_inertia_csys));

    if (collide) {
        assert(material);
        // avoid passing to collision the inner points discarded by convex hull
        // processor, so use mesh vertexes instead of all argument points
        std::vector<ChVector<>> points_reduced;
        points_reduced.resize(vshape->GetMesh()->getCoordsVertices().size());
        for (unsigned int i = 0; i < vshape->GetMesh()->getCoordsVertices().size(); ++i)
            points_reduced[i] = vshape->GetMesh()->getCoordsVertices()[i];

        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddConvexHull(material, points_reduced);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }

    m_mesh = vshape->GetMesh();
}